

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_ParseInt32::test_method(test_ParseInt32 *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  bool bVar1;
  long in_FS_OFFSET;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_ffffffffffffef08;
  undefined7 in_stack_ffffffffffffef10;
  undefined1 in_stack_ffffffffffffef17;
  assertion_result *in_stack_ffffffffffffef18;
  assertion_result *this_00;
  char *in_stack_ffffffffffffef20;
  char *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef28;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  lazy_ostream *in_stack_ffffffffffffef30;
  size_t in_stack_ffffffffffffef38;
  assertion_result *line_num;
  const_string *in_stack_ffffffffffffef40;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffef48;
  unit_test_log_t *this_02;
  test_ParseInt32 *this_local;
  const_string local_dd0 [2];
  lazy_ostream local_db0 [3];
  assertion_result local_d80;
  basic_string_view<char,_std::char_traits<char>_> local_d68;
  char local_d58 [16];
  const_string local_d48 [2];
  lazy_ostream local_d28 [3];
  assertion_result local_cf8;
  unit_test_log_t local_ce0 [2];
  const_string local_cd0;
  const_string local_cc0 [2];
  lazy_ostream local_ca0 [3];
  assertion_result local_c70 [2];
  const_string local_c38 [2];
  lazy_ostream local_c18 [3];
  assertion_result local_be8 [2];
  const_string local_bb0 [2];
  lazy_ostream local_b90 [2];
  assertion_result local_b70 [2];
  const_string local_b38 [2];
  lazy_ostream local_b18 [3];
  assertion_result local_ae8 [2];
  const_string local_ab0 [2];
  lazy_ostream local_a90 [3];
  assertion_result local_a60 [2];
  const_string local_a28 [2];
  lazy_ostream local_a08 [3];
  assertion_result local_9d8 [2];
  const_string local_9a0 [2];
  lazy_ostream local_980 [3];
  assertion_result local_950 [2];
  const_string local_918 [2];
  lazy_ostream local_8f8 [3];
  assertion_result local_8c8 [2];
  const_string local_890 [2];
  lazy_ostream local_870 [3];
  assertion_result local_840 [2];
  const_string local_808 [2];
  lazy_ostream local_7e8 [3];
  assertion_result local_7b8 [2];
  const_string local_780 [2];
  lazy_ostream local_760 [3];
  assertion_result local_730 [2];
  const_string local_6f8 [2];
  lazy_ostream local_6d8 [3];
  assertion_result local_6a8 [2];
  const_string local_670 [2];
  lazy_ostream local_650 [3];
  assertion_result local_620 [2];
  const_string local_5e8 [2];
  lazy_ostream local_5c8 [3];
  assertion_result local_598 [2];
  const_string local_560 [2];
  lazy_ostream local_540 [3];
  assertion_result local_510 [2];
  const_string local_4d8 [2];
  lazy_ostream local_4b8 [3];
  assertion_result local_488 [2];
  const_string local_450 [2];
  lazy_ostream local_430 [3];
  assertion_result local_400 [2];
  const_string local_3c8 [2];
  lazy_ostream local_3a8 [3];
  assertion_result local_378 [2];
  const_string local_340 [2];
  lazy_ostream local_320 [3];
  assertion_result local_2f0 [2];
  const_string local_2b8 [2];
  lazy_ostream local_298 [3];
  assertion_result local_268 [2];
  const_string local_230 [2];
  lazy_ostream local_210 [3];
  assertion_result local_1e0 [2];
  const_string local_1a8 [2];
  lazy_ostream local_188 [3];
  assertion_result local_158 [2];
  const_string local_120 [2];
  lazy_ostream local_100 [3];
  assertion_result local_d0 [2];
  const_string local_98 [2];
  lazy_ostream local_78 [3];
  assertion_result local_48 [2];
  int32_t n;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str._M_str = (char *)in_stack_ffffffffffffef28;
    str._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_48,local_78,local_98,0x274,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_00._M_str = (char *)in_stack_ffffffffffffef28;
    str_00._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_00,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d0,local_100,local_120,0x275,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_01._M_str = (char *)in_stack_ffffffffffffef28;
    str_01._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_01,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_158,local_188,local_1a8,0x276,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_02._M_str = (char *)in_stack_ffffffffffffef28;
    str_02._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_02,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e0,local_210,local_230,0x277,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_03._M_str = (char *)in_stack_ffffffffffffef28;
    str_03._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_03,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_268,local_298,local_2b8,0x278,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_04._M_str = (char *)in_stack_ffffffffffffef28;
    str_04._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_04,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2f0,local_320,local_340,0x279,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_05._M_str = (char *)in_stack_ffffffffffffef28;
    str_05._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_05,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_378,local_3a8,local_3c8,0x27a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_06._M_str = (char *)in_stack_ffffffffffffef28;
    str_06._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_06,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_400,local_430,local_450,0x27b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_07._M_str = (char *)in_stack_ffffffffffffef28;
    str_07._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_07,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_488,local_4b8,local_4d8,0x27c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_08._M_str = (char *)in_stack_ffffffffffffef28;
    str_08._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_08,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_540,local_560,0x27d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_09._M_str = (char *)in_stack_ffffffffffffef28;
    str_09._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_09,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_598,local_5c8,local_5e8,0x27e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_10._M_str = (char *)in_stack_ffffffffffffef28;
    str_10._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_10,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_620,local_650,local_670,0x280,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_11._M_str = (char *)in_stack_ffffffffffffef28;
    str_11._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_11,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6a8,local_6d8,local_6f8,0x281,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_12._M_str = (char *)in_stack_ffffffffffffef28;
    str_12._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_12,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_730,local_760,local_780,0x282,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_13._M_str = (char *)in_stack_ffffffffffffef28;
    str_13._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_13,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_7e8,local_808,0x283,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_14._M_str = (char *)in_stack_ffffffffffffef28;
    str_14._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_14,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_840,local_870,local_890,0x284,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_15._M_str = (char *)in_stack_ffffffffffffef28;
    str_15._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_15,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8c8,local_8f8,local_918,0x285,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_16._M_str = (char *)in_stack_ffffffffffffef28;
    str_16._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_16,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_950,local_980,local_9a0,0x286,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_17._M_str = (char *)in_stack_ffffffffffffef28;
    str_17._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_17,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9d8,local_a08,local_a28,0x287,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_18._M_str = (char *)in_stack_ffffffffffffef28;
    str_18._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_18,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a60,local_a90,local_ab0,0x288,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_19._M_str = (char *)in_stack_ffffffffffffef28;
    str_19._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_19,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ae8,local_b18,local_b38,0x289,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffef28);
    str_20._M_str = (char *)in_stack_ffffffffffffef28;
    str_20._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_20,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b70,local_b90,local_bb0,0x28a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_21._M_str = (char *)in_stack_ffffffffffffef28;
    str_21._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_21,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_be8,local_c18,local_c38,0x28c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef48,in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,
               (const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_22._M_str = (char *)in_stack_ffffffffffffef28;
    str_22._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_22,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c70,local_ca0,local_cc0,0x28d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_cd0;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    this_02 = local_ce0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,file,(size_t)line_num,(const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    str_23._M_str = (char *)in_stack_ffffffffffffef28;
    str_23._M_len = (size_t)in_stack_ffffffffffffef20;
    ParseInt32(str_23,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffef18,(bool)in_stack_ffffffffffffef17);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef18,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_cf8,local_d28,local_d48,0x28e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    __str = local_d58;
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    this_01 = &local_d68;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,file,(size_t)line_num,(const_string *)in_stack_ffffffffffffef30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_01,__str);
    str_24._M_str = (char *)this_01;
    str_24._M_len = (size_t)__str;
    ParseInt32(str_24,(int32_t *)in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::assertion_result(this_00,(bool)in_stack_ffffffffffffef17);
    in_stack_ffffffffffffef30 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (basic_cstring<const_char> *)in_stack_ffffffffffffef08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_00,
               (pointer)CONCAT17(in_stack_ffffffffffffef17,in_stack_ffffffffffffef10),
               (unsigned_long)in_stack_ffffffffffffef08);
    in_stack_ffffffffffffef08 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_d80,local_db0,local_dd0,0x28f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_ffffffffffffef08);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef08);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ParseInt32)
{
    int32_t n;
    // Valid values
    BOOST_CHECK(ParseInt32("1234", nullptr));
    BOOST_CHECK(ParseInt32("0", &n) && n == 0);
    BOOST_CHECK(ParseInt32("1234", &n) && n == 1234);
    BOOST_CHECK(ParseInt32("01234", &n) && n == 1234); // no octal
    BOOST_CHECK(ParseInt32("2147483647", &n) && n == 2147483647);
    BOOST_CHECK(ParseInt32("-2147483648", &n) && n == (-2147483647 - 1)); // (-2147483647 - 1) equals INT_MIN
    BOOST_CHECK(ParseInt32("-1234", &n) && n == -1234);
    BOOST_CHECK(ParseInt32("00000000000000001234", &n) && n == 1234);
    BOOST_CHECK(ParseInt32("-00000000000000001234", &n) && n == -1234);
    BOOST_CHECK(ParseInt32("00000000000000000000", &n) && n == 0);
    BOOST_CHECK(ParseInt32("-00000000000000000000", &n) && n == 0);
    // Invalid values
    BOOST_CHECK(!ParseInt32("", &n));
    BOOST_CHECK(!ParseInt32(" 1", &n)); // no padding inside
    BOOST_CHECK(!ParseInt32("1 ", &n));
    BOOST_CHECK(!ParseInt32("++1", &n));
    BOOST_CHECK(!ParseInt32("+-1", &n));
    BOOST_CHECK(!ParseInt32("-+1", &n));
    BOOST_CHECK(!ParseInt32("--1", &n));
    BOOST_CHECK(!ParseInt32("1a", &n));
    BOOST_CHECK(!ParseInt32("aap", &n));
    BOOST_CHECK(!ParseInt32("0x1", &n)); // no hex
    BOOST_CHECK(!ParseInt32(STRING_WITH_EMBEDDED_NULL_CHAR, &n));
    // Overflow and underflow
    BOOST_CHECK(!ParseInt32("-2147483649", nullptr));
    BOOST_CHECK(!ParseInt32("2147483648", nullptr));
    BOOST_CHECK(!ParseInt32("-32482348723847471234", nullptr));
    BOOST_CHECK(!ParseInt32("32482348723847471234", nullptr));
}